

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O1

char * mbedtls_md_get_name(mbedtls_md_info_t *md_info)

{
  md_name_entry *pmVar1;
  mbedtls_md_type_t mVar2;
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    return (char *)0x0;
  }
  pmVar1 = md_names;
  mVar2 = MBEDTLS_MD_SHA224;
  do {
    if (mVar2 == md_info->type) goto LAB_0022aee7;
    mVar2 = pmVar1[1].md_type;
    pmVar1 = pmVar1 + 1;
  } while (mVar2 != MBEDTLS_MD_NONE);
  pmVar1 = md_names + 2;
LAB_0022aee7:
  return pmVar1->md_name;
}

Assistant:

const char *mbedtls_md_get_name(const mbedtls_md_info_t *md_info)
{
    if (md_info == NULL) {
        return NULL;
    }

    const md_name_entry *entry = md_names;
    while (entry->md_type != MBEDTLS_MD_NONE &&
           entry->md_type != md_info->type) {
        ++entry;
    }

    return entry->md_name;
}